

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::AddLogSink(LogSink *destination)

{
  _Head_base<0UL,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_*,_false> __p;
  _Head_base<0UL,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_*,_false>
  local_18;
  value_type local_10;
  
  std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)sink_mutex_);
  if (sinks_ == (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0) {
    std::make_unique<std::vector<google::LogSink*,std::allocator<google::LogSink*>>>();
    __p._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (pointer)0x0;
    std::
    __uniq_ptr_impl<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
             *)&sinks_,__p._M_head_impl);
    std::
    unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                   *)&local_18);
  }
  std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::push_back(sinks_,&local_10);
  pthread_rwlock_unlock((pthread_rwlock_t *)sink_mutex_);
  return;
}

Assistant:

inline void LogDestination::AddLogSink(LogSink* destination) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  SinkLock l{sink_mutex_};
  if (sinks_ == nullptr) sinks_ = std::make_unique<std::vector<LogSink*>>();
  sinks_->push_back(destination);
}